

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_filter_program.c
# Opt level: O0

int program_filter_close(archive_read_filter *self)

{
  int iVar1;
  archive_read_filter *in_RDI;
  int e;
  program_filter *state;
  program_filter *state_00;
  
  state_00 = (program_filter *)in_RDI->data;
  iVar1 = child_stop(in_RDI,state_00);
  free(state_00->out_buf);
  archive_string_free((archive_string *)0x127da2);
  free(state_00);
  return iVar1;
}

Assistant:

static int
program_filter_close(struct archive_read_filter *self)
{
	struct program_filter	*state;
	int e;

	state = (struct program_filter *)self->data;
	e = child_stop(self, state);

	/* Release our private data. */
	free(state->out_buf);
	archive_string_free(&state->description);
	free(state);

	return (e);
}